

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O0

KeyValues * __thiscall KV::KeyValues::get(KeyValues *this,string *name,size_t index)

{
  pointer ppVar1;
  type pKVar2;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>
  local_38;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>
  it;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>_>
  range;
  size_t index_local;
  string *name_local;
  KeyValues *this_local;
  
  _it = std::
        multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>,_KV::KeyValues::kvCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>_>
        ::equal_range(&this->keyvalues,name);
  local_38._M_node = it._M_node;
  std::
  advance<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>,unsigned_long>
            (&local_38,index);
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>
           ::operator->(&local_38);
  pKVar2 = std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>::operator*
                     (&ppVar1->second);
  return pKVar2;
}

Assistant:

KeyValues &KeyValues::get( const std::string &name, size_t index )
	{
		auto range = keyvalues.equal_range( name );

		auto it = range.first;
		std::advance( it, index );

		return *it->second;
	}